

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_jpege_base.c
# Opt level: O0

void get_msb_lsb_at_pos(RK_U32 *msb,RK_U32 *lsb,RK_U8 *buf,RK_U32 bytepos)

{
  uint uVar1;
  byte *pbVar2;
  uint local_3c;
  RK_U32 i;
  RK_U8 *tmp;
  uint local_28;
  RK_S32 left_byte;
  RK_U32 val32;
  RK_U32 bytepos_local;
  RK_U8 *buf_local;
  RK_U32 *lsb_local;
  RK_U32 *msb_local;
  
  uVar1 = bytepos & 7;
  pbVar2 = buf + (bytepos & 0xfffffff8);
  local_3c = uVar1;
  if (uVar1 != 0) {
    for (; local_3c < 8; local_3c = local_3c + 1) {
      pbVar2[local_3c] = 0;
    }
  }
  *msb = (uint)*pbVar2 << 0x18 | (uint)pbVar2[1] << 0x10 | (uint)pbVar2[2] << 8 | (uint)pbVar2[3];
  if (uVar1 < 5) {
    local_28 = 0;
  }
  else {
    local_28 = (uint)pbVar2[4] << 0x18 | (uint)pbVar2[5] << 0x10 | (uint)pbVar2[6] << 8;
  }
  *lsb = local_28;
  return;
}

Assistant:

void get_msb_lsb_at_pos(RK_U32 *msb, RK_U32 *lsb, RK_U8 *buf, RK_U32 bytepos)
{
    RK_U32 val32;
    RK_S32 left_byte = bytepos & 0x7;
    RK_U8 *tmp = buf + (bytepos & (~0x7));

    // clear the rest bytes in 64bit
    if (left_byte) {
        RK_U32 i;

        for (i = left_byte; i < 8; i++)
            tmp[i] = 0;
    }

    val32 = (tmp[0] << 24) |
            (tmp[1] << 16) |
            (tmp[2] <<  8) |
            (tmp[3] <<  0);

    *msb = val32;

    if (left_byte > 4) {
        val32 = (tmp[4] << 24) |
                (tmp[5] << 16) |
                (tmp[6] <<  8);
    } else
        val32 = 0;

    *lsb = val32;
}